

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

char * upb_MtDataEncoder_PutBase92Varint
                 (upb_MtDataEncoder *e,char *ptr,uint32_t val,int min,int max)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  
  cVar3 = _upb_FromBase92((uint8_t)max);
  cVar4 = _upb_FromBase92((uint8_t)min);
  uVar6 = (int)cVar3 - (int)cVar4;
  uVar1 = 0x1f;
  if (uVar6 != 0) {
    for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar5 = 0;
  if (0 < (int)uVar6) {
    uVar5 = (uVar1 ^ 0xffffffe0) + 0x21;
  }
  if (uVar5 < 7) {
    do {
      ptr = upb_MtDataEncoder_Put(e,ptr,((byte)val & ~(byte)(-1 << ((byte)uVar5 & 0x1f))) + cVar4);
      bVar2 = (byte)uVar5 & 0x1f;
      if (ptr == (char *)0x0) {
        return (char *)0x0;
      }
      uVar1 = val >> bVar2;
      val = val >> bVar2;
    } while (uVar1 != 0);
    return ptr;
  }
  __assert_fail("shift <= 6",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/internal/encode.c"
                ,0x45,
                "char *upb_MtDataEncoder_PutBase92Varint(upb_MtDataEncoder *, char *, uint32_t, int, int)"
               );
}

Assistant:

static char* upb_MtDataEncoder_PutBase92Varint(upb_MtDataEncoder* e, char* ptr,
                                               uint32_t val, int min, int max) {
  int shift = upb_Log2Ceiling(_upb_FromBase92(max) - _upb_FromBase92(min) + 1);
  UPB_ASSERT(shift <= 6);
  uint32_t mask = (1 << shift) - 1;
  do {
    uint32_t bits = val & mask;
    ptr = upb_MtDataEncoder_Put(e, ptr, bits + _upb_FromBase92(min));
    if (!ptr) return NULL;
    val >>= shift;
  } while (val);
  return ptr;
}